

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

InstanceNameSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::InstanceNameSyntax,slang::parsing::Token&,std::span<slang::syntax::VariableDimensionSyntax*,18446744073709551615ul>>
          (BumpAllocator *this,Token *args,
          span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> *args_1)

{
  Token name;
  InstanceNameSyntax *this_00;
  SyntaxList<slang::syntax::VariableDimensionSyntax> local_50;
  
  this_00 = (InstanceNameSyntax *)allocate(this,0x60,8);
  name.kind = args->kind;
  name._2_1_ = args->field_0x2;
  name.numFlags.raw = (args->numFlags).raw;
  name.rawLen = args->rawLen;
  name.info = args->info;
  local_50.super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>._M_ptr =
       args_1->_M_ptr;
  local_50.super_SyntaxListBase.childCount = (args_1->_M_extent)._M_extent_value;
  local_50.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_50.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_50.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_50.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005e8000;
  local_50.super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = local_50.super_SyntaxListBase.childCount;
  slang::syntax::InstanceNameSyntax::InstanceNameSyntax(this_00,name,&local_50);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }